

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

Pda * namingConventions::makeNamePda(string *name)

{
  Node *pNVar1;
  Node *pNVar2;
  Pda *this;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar3;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar4;
  ulong uVar5;
  size_type sVar6;
  bool bVar7;
  uint __val;
  ulong local_198;
  string alphabeth;
  string nodename;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Pda *)operator_new(0x90);
  Pda::Pda(this);
  alphabeth._M_dataplus._M_p = (pointer)&alphabeth.field_2;
  alphabeth._M_string_length = 0;
  alphabeth.field_2._M_local_buf[0] = '\0';
  for (__val = 0; uVar5 = (ulong)__val, uVar5 < name->_M_string_length + 1; __val = __val + 1) {
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&nodename,"q",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&nodename);
    Pda::addNode(this,&local_70,uVar5 == 0,name->_M_string_length == uVar5);
    std::__cxx11::string::~string((string *)&local_70);
    bVar7 = false;
    for (sVar6 = 0; alphabeth._M_string_length != sVar6; sVar6 = sVar6 + 1) {
      bVar7 = (bool)(bVar7 | alphabeth._M_dataplus._M_p[sVar6] == (name->_M_dataplus)._M_p[uVar5]);
    }
    if (!bVar7) {
      std::__cxx11::string::push_back((char)&alphabeth);
    }
    std::__cxx11::string::~string((string *)&nodename);
  }
  local_198 = 1;
  while( true ) {
    pvVar3 = Pda::getAllNodes(this);
    uVar5 = (ulong)((int)local_198 - 1);
    if (((long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U <= uVar5) break;
    pvVar3 = Pda::getAllNodes(this);
    pNVar1 = (pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar5];
    pvVar3 = Pda::getAllNodes(this);
    pNVar2 = (pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_start[local_198];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90," ",(allocator<char> *)&nodename);
    Pda::addFunct(this,pNVar1,pNVar2,' ',&local_90,(name->_M_dataplus)._M_p[uVar5]);
    std::__cxx11::string::~string((string *)&local_90);
    local_198 = (ulong)((int)local_198 + 1);
  }
  pvVar3 = Pda::getAllNodes(this);
  pNVar1 = *(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar3 = Pda::getAllNodes(this);
  pNVar2 = *(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0," ",(allocator<char> *)&nodename);
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_b0,' ');
  std::__cxx11::string::~string((string *)&local_b0);
  pvVar3 = Pda::getAllNodes(this);
  pvVar4 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar4->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar4->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar3 = Pda::getAllNodes(this);
  pvVar4 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar4->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar4->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0," ",(allocator<char> *)&nodename);
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_d0,' ');
  std::__cxx11::string::~string((string *)&local_d0);
  pvVar3 = Pda::getAllNodes(this);
  pvVar4 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar4->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar4->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar3 = Pda::getAllNodes(this);
  pvVar4 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar4->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar4->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0," ",(allocator<char> *)&nodename);
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_f0,'(');
  std::__cxx11::string::~string((string *)&local_f0);
  pvVar3 = Pda::getAllNodes(this);
  pvVar4 = Pda::getAllNodes(this);
  pNVar1 = *(Node **)((long)(pvVar4->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar4->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  pvVar3 = Pda::getAllNodes(this);
  pvVar4 = Pda::getAllNodes(this);
  pNVar2 = *(Node **)((long)(pvVar4->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish +
                     (long)(pvVar3->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)
                           ._M_impl.super__Vector_impl_data._M_start +
                     (-8 - (long)(pvVar4->
                                 super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110," ",(allocator<char> *)&nodename);
  Pda::addFunct(this,pNVar1,pNVar2,' ',&local_110,')');
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,(string *)&alphabeth);
  Pda::setAlphabet(this,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_150,(string *)&alphabeth);
  Pda::setStackAlphabet(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&alphabeth);
  return this;
}

Assistant:

Pda *namingConventions::makeNamePda(std::string &name) {
    Pda *p = new Pda();
    std::string alphabeth;
    for (unsigned int c = 0; c < name.size() + 1; ++c) {
        std::string nodename = "q" + std::to_string(c);
        p->addNode(nodename, c == 0, c == name.size());
        bool present = false;
        for (char &ch: alphabeth) {
            if (ch == name[c]) {
                present = true;
            }
        }
        if (!present) {
            alphabeth += name[c];
        }
    }
    for (unsigned int i = 0; i < p->getAllNodes().size() - 1; ++i) {
        p->addFunct(p->getAllNodes()[i], p->getAllNodes()[i + 1], ' ', " ", name[i]);
    }
    p->addFunct(p->getAllNodes()[0], p->getAllNodes()[0], ' ', " ", ' ');
    p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
                " ", ' ');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", '(');
  p->addFunct(p->getAllNodes()[p->getAllNodes().size() - 1], p->getAllNodes()[p->getAllNodes().size() - 1], ' ',
              " ", ')');


    p->setAlphabet(alphabeth);
    p->setStackAlphabet(alphabeth);
    return p;
}